

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void ws_fini(void *arg)

{
  nni_mtx *mtx;
  nni_list *pnVar1;
  ws_frame *pwVar2;
  nni_aio *aio;
  
  ws_stop(arg);
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  pnVar1 = (nni_list *)((long)arg + 0xd0);
  pwVar2 = (ws_frame *)nni_list_first(pnVar1);
  while (pwVar2 != (ws_frame *)0x0) {
    nni_list_remove(pnVar1,pwVar2);
    ws_frame_fini(pwVar2);
    pwVar2 = (ws_frame *)nni_list_first(pnVar1);
  }
  pnVar1 = (nni_list *)((long)arg + 0xb8);
  pwVar2 = (ws_frame *)nni_list_first(pnVar1);
  while (pwVar2 != (ws_frame *)0x0) {
    nni_list_remove(pnVar1,pwVar2);
    ws_frame_fini(pwVar2);
    pwVar2 = (ws_frame *)nni_list_first(pnVar1);
  }
  if (*(ws_frame **)((long)arg + 0xf0) != (ws_frame *)0x0) {
    ws_frame_fini(*(ws_frame **)((long)arg + 0xf0));
  }
  if (*(ws_frame **)((long)arg + 0xe8) != (ws_frame *)0x0) {
    ws_frame_fini(*(ws_frame **)((long)arg + 0xe8));
  }
  while ((aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0xa0)), aio != (nni_aio *)0x0 ||
         (aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x88)), aio != (nni_aio *)0x0)))
  {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  nni_mtx_unlock(mtx);
  if (*(nni_http_conn **)((long)arg + 0x9e8) != (nni_http_conn *)0x0) {
    nni_http_conn_fini(*(nni_http_conn **)((long)arg + 0x9e8));
  }
  nni_aio_fini((nni_aio *)((long)arg + 0x2c0));
  nni_aio_fini((nni_aio *)((long)arg + 0xf8));
  nni_aio_fini((nni_aio *)((long)arg + 0x488));
  nni_aio_fini((nni_aio *)((long)arg + 0x650));
  nni_aio_fini((nni_aio *)((long)arg + 0x818));
  nni_mtx_fini(mtx);
  nni_free(arg,0xb28);
  return;
}

Assistant:

static void
ws_fini(void *arg)
{
	nni_ws   *ws = arg;
	ws_frame *frame;
	nng_aio  *aio;

	ws_stop(ws);

	nni_mtx_lock(&ws->mtx);
	while ((frame = nni_list_first(&ws->rxq)) != NULL) {
		nni_list_remove(&ws->rxq, frame);
		ws_frame_fini(frame);
	}

	while ((frame = nni_list_first(&ws->txq)) != NULL) {
		nni_list_remove(&ws->txq, frame);
		ws_frame_fini(frame);
	}

	if (ws->rxframe != NULL) {
		ws_frame_fini(ws->rxframe);
	}
	if (ws->txframe != NULL) {
		ws_frame_fini(ws->txframe);
	}

	while (((aio = nni_list_first(&ws->recvq)) != NULL) ||
	    ((aio = nni_list_first(&ws->sendq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_mtx_unlock(&ws->mtx);

	if (ws->http) {
		nni_http_conn_fini(ws->http);
	}

	nni_aio_fini(&ws->rxaio);
	nni_aio_fini(&ws->txaio);
	nni_aio_fini(&ws->closeaio);
	nni_aio_fini(&ws->httpaio);
	nni_aio_fini(&ws->connaio);
	nni_mtx_fini(&ws->mtx);
	NNI_FREE_STRUCT(ws);
}